

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scsp.c
# Opt level: O2

UINT8 device_start_scsp(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 UVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  float fVar5;
  uint uVar6;
  DEV_DATA info;
  void *pvVar7;
  undefined1 *puVar8;
  int iVar9;
  undefined4 uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  UINT8 UVar14;
  int iVar15;
  uint uVar16;
  int (*paiVar17) [256];
  uint uVar18;
  ulong uVar19;
  int (*paiVar20) [256];
  bool bVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  info.chipInf = calloc(1,0x82e58);
  if ((DEV_DATA *)info.chipInf == (DEV_DATA *)0x0) {
    UVar14 = 0xff;
  }
  else {
    uVar16 = cfg->clock;
    SCSPDSP_Init((SCSPDSP *)((long)info.chipInf + 0x82688));
    *(uint *)((long)info.chipInf + 0x144c) = uVar16;
    *(uint *)&((DEV_DATA *)((long)info.chipInf + 0x1450))->chipInf = uVar16 >> 9;
    *(undefined2 *)((long)info.chipInf + 0x1476) = 0;
    *(undefined2 *)((long)info.chipInf + 0x1454) = 0;
    *(undefined4 *)&((DEV_DATA *)((long)info.chipInf + 0x1448))->chipInf = 0x80000;
    pvVar7 = malloc(0x80000);
    ((DEV_DATA *)((long)info.chipInf + 0x1440))->chipInf = pvVar7;
    *(undefined4 *)&((DEV_DATA *)((long)info.chipInf + 0x82690))->chipInf = 0x40000;
    ((DEV_DATA *)((long)info.chipInf + 0x82688))->chipInf = pvVar7;
    iVar15 = -0xbfd;
    for (lVar12 = 0x51e; lVar12 != 0x91e; lVar12 = lVar12 + 1) {
      dVar2 = pow(10.0,(double)((float)iVar15 * 0.03125) / 20.0);
      *(int *)((long)info.chipInf + lVar12 * 4) = (int)(dVar2 * 4096.0);
      iVar15 = iVar15 + 3;
    }
    for (uVar19 = 0; uVar19 != 0x10000; uVar19 = uVar19 + 1) {
      fVar22 = 0.0;
      if ((uVar19 & 1) != 0) {
        fVar22 = -0.4;
      }
      uVar16 = (uint)uVar19;
      auVar24._0_4_ = -(uint)((uVar16 & 0xf00) == 0xf00);
      auVar24._4_4_ = -(uint)((uVar19 & 0x80) == 0);
      auVar24._8_4_ = -(uint)((uVar19 & 0x40) == 0);
      auVar24._12_4_ = -(uint)((uVar19 & 0x20) == 0);
      auVar25._0_4_ = -(uint)((uVar19 & 0x10) == 0);
      auVar25._4_4_ = -(uint)((uVar19 & 8) == 0);
      auVar25._8_4_ = -(uint)((uVar19 & 4) == 0);
      auVar25._12_4_ = -(uint)((uVar19 & 2) == 0);
      auVar25 = packssdw(auVar24,auVar25);
      auVar25 = packsswb(auVar25,auVar25);
      if ((auVar25 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar22 = fVar22 + -0.8;
      }
      if ((auVar25 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar22 = fVar22 + -1.5;
      }
      if ((auVar25 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar22 = fVar22 + -3.0;
      }
      if ((auVar25 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar22 = fVar22 + -6.0;
      }
      if ((auVar25 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar22 = fVar22 + -12.0;
      }
      if ((auVar25 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar22 = fVar22 + -24.0;
      }
      if ((auVar25 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar22 = fVar22 + -48.0;
      }
      dVar2 = pow(10.0,(double)fVar22 / 20.0);
      fVar22 = 0.0;
      if ((auVar25 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar22 = 0.0;
        if ((uVar16 >> 8 & 1) != 0) {
          fVar22 = -3.0;
        }
        if ((uVar16 >> 9 & 1) != 0) {
          fVar22 = fVar22 + -6.0;
        }
        if ((uVar16 >> 10 & 1) != 0) {
          fVar22 = fVar22 + -12.0;
        }
        if ((uVar16 >> 0xb & 1) != 0) {
          fVar22 = fVar22 + -24.0;
        }
        dVar3 = pow(10.0,(double)fVar22 / 20.0);
        fVar22 = (float)dVar3 * 4.0;
      }
      if ((uVar16 >> 0xc & 1) == 0) {
        fVar5 = 4.0;
      }
      else {
        fVar5 = fVar22;
        fVar22 = 4.0;
      }
      fVar23 = 0.0;
      if (0x1fff < uVar19) {
        dVar3 = pow(10.0,(double)SDLT[(uint)(uVar19 >> 0xd) & 0x7ffff] / 20.0);
        fVar23 = (float)dVar3;
      }
      *(int *)((long)info.chipInf + uVar19 * 4 + 0x2478) =
           (int)(long)(fVar22 * (float)dVar2 * fVar23 * 4096.0);
      *(int *)((long)info.chipInf + uVar19 * 4 + 0x42478) =
           (int)(long)(fVar5 * (float)dVar2 * fVar23 * 4096.0);
    }
    ((DEV_DATA *)((long)info.chipInf + 0x82588))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)info.chipInf + 0x82488))->chipInf = (void *)0x0;
    uVar19 = 2;
    for (lVar12 = 0; lVar12 != 0xf8; lVar12 = lVar12 + 4) {
      iVar15 = 0x4000000;
      if ((uVar19 | 0xffffffc0) < 0xfffffffe) {
        iVar15 = (int)((1023000.0 / (*(double *)((long)ARTimes + lVar12 * 2 + 0x10) * 44100.0)) *
                      65536.0);
      }
      dVar2 = *(double *)((long)DRTimes + lVar12 * 2 + 0x10);
      *(int *)((long)info.chipInf + lVar12 + 0x82490) = iVar15;
      *(int *)((long)info.chipInf + lVar12 + 0x82590) =
           (int)((1023000.0 / (dVar2 * 44100.0)) * 65536.0);
      uVar19 = uVar19 + 1;
    }
    puVar8 = (undefined1 *)((long)info.chipInf + 0x59);
    for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 1) {
      *(int *)(puVar8 + 0x6f) = (int)lVar12;
      *puVar8 = 0;
      *(undefined8 *)(puVar8 + 7) = 0;
      *(undefined4 *)(puVar8 + 0x1f) = 3;
      puVar8 = puVar8 + 0x98;
    }
    if (IsInit == '\0') {
      uVar18 = 0x100;
      uVar16 = 0;
      iVar15 = 0xff;
      uVar19 = 0;
      for (lVar12 = 0; lVar12 != 0x400; lVar12 = lVar12 + 4) {
        iVar4 = (int)uVar19;
        uVar11 = uVar18 - 1;
        uVar6 = uVar11;
        if (uVar19 < 0x40) {
          uVar6 = uVar16;
        }
        *(int *)((long)ALFO_SAW + lVar12) = iVar15;
        bVar21 = uVar19 < 0x80;
        iVar9 = iVar4 + -0x100;
        if (bVar21) {
          iVar9 = iVar4;
        }
        *(int *)((long)PLFO_SAW + lVar12) = iVar9;
        uVar10 = 0;
        if (bVar21) {
          uVar10 = 0xff;
        }
        *(undefined4 *)((long)ALFO_SQR + lVar12) = uVar10;
        uVar10 = 0xffffff80;
        if (bVar21) {
          uVar10 = 0x7f;
        }
        *(undefined4 *)((long)PLFO_SQR + lVar12) = uVar10;
        if ((!bVar21) && (uVar6 = uVar18, uVar11 = uVar16 - 0x100, 0xbf < uVar19)) {
          uVar6 = iVar4 * 2 | 0xfffffe01;
        }
        *(uint *)((long)ALFO_TRI + lVar12) = uVar11;
        *(uint *)((long)PLFO_TRI + lVar12) = uVar6;
        uVar11 = rand();
        *(uint *)((long)ALFO_NOI + lVar12) = uVar11 & 0xff;
        *(uint *)((long)PLFO_NOI + lVar12) = 0x80 - (uVar11 & 0xff);
        uVar19 = uVar19 + 1;
        uVar18 = uVar18 - 2;
        uVar16 = uVar16 + 2;
        iVar15 = iVar15 + -1;
      }
      paiVar20 = PSCALES;
      paiVar17 = ASCALES;
      for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
        fVar22 = PSCALE[lVar12];
        for (lVar13 = 0; lVar13 != 0x100; lVar13 = lVar13 + 1) {
          dVar2 = exp2(((double)((float)((int)lVar13 + -0x80) * fVar22) * 0.0078125) / 1200.0);
          (*paiVar20)[lVar13] = (int)(long)(dVar2 * 256.0);
        }
        fVar22 = AMPLITUDE_SCALE_LIMIT[lVar12];
        for (lVar13 = 0; lVar13 != 0x100; lVar13 = lVar13 + 1) {
          dVar2 = pow(10.0,((double)((float)(int)lVar13 * -fVar22) * 0.00390625) / 20.0);
          (*paiVar17)[lVar13] = (int)(long)(dVar2 * 256.0);
        }
        paiVar20 = paiVar20 + 1;
        paiVar17 = paiVar17 + 1;
      }
      IsInit = '\x01';
    }
    *(undefined2 *)&((DEV_DATA *)((long)info.chipInf + 0x28))->chipInf = 0;
    UVar14 = '\0';
    scsp_set_mute_mask(info.chipInf,0);
    *(void **)info.chipInf = info.chipInf;
    UVar1 = *(UINT32 *)((long)info.chipInf + 0x1450);
    retDevInf->dataPtr = (DEV_DATA *)info.chipInf;
    retDevInf->sampleRate = UVar1;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar14;
}

Assistant:

static UINT8 device_start_scsp(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	scsp_state *scsp;

	scsp = (scsp_state *)calloc(1, sizeof(scsp_state));
	if (scsp == NULL)
		return 0xFF;

	// init the emulation
	SCSP_Init(scsp, cfg->clock);

	scsp_set_mute_mask(scsp, 0x00000000);

	scsp->_devData.chipInf = scsp;
	INIT_DEVINF(retDevInf, &scsp->_devData, scsp->rate, &devDef);

	return 0x00;
}